

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostl.c
# Opt level: O1

void trico_remove_duplicate_vertices
               (uint32_t *nr_of_vertices,float **vertices,uint32_t nr_of_triangles,
               uint32_t **triangles)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  float *pfVar4;
  float fVar5;
  float *pfVar6;
  float *L;
  float *pfVar7;
  ulong uVar8;
  float *pfVar9;
  uint32_t uVar10;
  float *pfVar11;
  
  if (nr_of_triangles == 0) {
    return;
  }
  L = (float *)malloc((ulong)(nr_of_triangles * 3) << 4);
  puVar3 = *triangles;
  pfVar4 = *vertices;
  uVar8 = 0;
  pfVar9 = L;
  do {
    fVar5 = (float)uVar8;
    uVar10 = puVar3[uVar8 & 0xffffffff];
    uVar1 = puVar3[(uint)((int)fVar5 + 1)];
    uVar2 = puVar3[(uint)((int)fVar5 + 2)];
    *pfVar9 = pfVar4[uVar10 * 3];
    pfVar9[1] = pfVar4[uVar10 * 3 + 1];
    pfVar9[2] = pfVar4[uVar10 * 3 + 2];
    pfVar9[3] = fVar5;
    pfVar9[4] = pfVar4[uVar1 * 3];
    pfVar9[5] = pfVar4[uVar1 * 3 + 1];
    pfVar9[6] = pfVar4[uVar1 * 3 + 2];
    pfVar9[7] = (float)((int)fVar5 + 1);
    pfVar9[8] = pfVar4[uVar2 * 3];
    pfVar9[9] = pfVar4[uVar2 * 3 + 1];
    pfVar9[10] = pfVar4[uVar2 * 3 + 2];
    pfVar9[0xb] = (float)((int)fVar5 + 2);
    pfVar9 = pfVar9 + 0xc;
    uVar8 = uVar8 + 3;
  } while ((ulong)nr_of_triangles * 3 != uVar8);
  trico_quicksort_vertices(L,0,(ulong)(nr_of_triangles * 3 - 1));
  *nr_of_vertices = 0;
  pfVar4 = *vertices;
  *pfVar4 = *L;
  pfVar4[1] = L[1];
  pfVar4[2] = L[2];
  puVar3 = *triangles;
  puVar3[(uint)L[3]] = 0;
  pfVar7 = L;
  pfVar9 = L;
  if (nr_of_triangles * 0xc != 4) {
    pfVar11 = L;
    pfVar6 = L + 4;
    do {
      pfVar7 = pfVar6;
      pfVar6 = pfVar9;
      if ((((*pfVar9 != pfVar11[4]) || (NAN(*pfVar9) || NAN(pfVar11[4]))) ||
          (pfVar9[1] != pfVar11[5])) || (NAN(pfVar9[1]) || NAN(pfVar11[5]))) {
joined_r0x0010c413:
        while (pfVar9 = pfVar6 + 4, pfVar6 != pfVar11) {
          puVar3[(uint)pfVar9[3]] = *nr_of_vertices;
          pfVar6 = pfVar9;
        }
        uVar10 = *nr_of_vertices + 1;
        *nr_of_vertices = uVar10;
        pfVar4[uVar10 * 3] = *pfVar9;
        pfVar4[uVar10 * 3 + 1] = pfVar6[5];
        pfVar4[uVar10 * 3 + 2] = pfVar6[6];
        puVar3[(uint)pfVar6[7]] = uVar10;
      }
      else if ((pfVar9[2] != pfVar11[6]) || (NAN(pfVar9[2]) || NAN(pfVar11[6])))
      goto joined_r0x0010c413;
      pfVar11 = pfVar7;
      pfVar6 = pfVar7 + 4;
    } while (pfVar7 + 4 != L + nr_of_triangles * 0xc);
  }
  for (; pfVar9 != pfVar7; pfVar9 = pfVar9 + 4) {
    puVar3[(uint)pfVar9[7]] = *nr_of_vertices;
  }
  *nr_of_vertices = *nr_of_vertices + 1;
  free(L);
  return;
}

Assistant:

static void trico_remove_duplicate_vertices(uint32_t* nr_of_vertices, float** vertices, uint32_t nr_of_triangles, uint32_t** triangles)
  {
  if (nr_of_triangles == 0)
    return;

  float* vert = (float*)trico_malloc(nr_of_triangles * 3 * sizeof(float) * 4);

  float* p_vert = vert;
  for (uint32_t i = 0; i < nr_of_triangles; ++i)
    {
    const uint32_t id0 = i * 3;
    const uint32_t id1 = id0 + 1;
    const uint32_t id2 = id1 + 1;
    const uint32_t v0 = (*triangles)[id0];
    const uint32_t v1 = (*triangles)[id1];
    const uint32_t v2 = (*triangles)[id2];


    *p_vert++ = (*vertices)[v0 * 3];
    *p_vert++ = (*vertices)[v0 * 3 + 1];
    *p_vert++ = (*vertices)[v0 * 3 + 2];
    *p_vert++ = *(const float*)(&id0);

    *p_vert++ = (*vertices)[v1 * 3];
    *p_vert++ = (*vertices)[v1 * 3 + 1];
    *p_vert++ = (*vertices)[v1 * 3 + 2];
    *p_vert++ = *(const float*)(&id1);

    *p_vert++ = (*vertices)[v2 * 3];
    *p_vert++ = (*vertices)[v2 * 3 + 1];
    *p_vert++ = (*vertices)[v2 * 3 + 2];
    *p_vert++ = *(const float*)(&id2);
    }

  trico_quicksort_vertices(vert, 0, (3 * nr_of_triangles) - 1);

  float* first = vert;
  float* last = vert + 3 * nr_of_triangles * 4;

  *nr_of_vertices = 0;

  float* result = first;
  (*vertices)[*nr_of_vertices * 3] = result[0];
  (*vertices)[*nr_of_vertices * 3 + 1] = result[1];
  (*vertices)[*nr_of_vertices * 3 + 2] = result[2];
  (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
  while ((first += 4) != last)
    {
    if (trico_equal_vertices(result, first) == 0)
      {
      while ((result += 4) != first)
        {
        (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
        }
      ++(*nr_of_vertices);
      (*vertices)[*nr_of_vertices * 3] = result[0];
      (*vertices)[*nr_of_vertices * 3 + 1] = result[1];
      (*vertices)[*nr_of_vertices * 3 + 2] = result[2];
      (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
      }
    }
  while ((result += 4) != first)
    {
    (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
    }
  ++(*nr_of_vertices);

  trico_free(vert);
  }